

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int luaK_exp2RK(FuncState *fs,expdesc *e)

{
  int iVar1;
  uint uVar2;
  Value *v;
  TValue k;
  Value local_30;
  undefined4 local_28;
  Value local_20;
  undefined4 local_18;
  
  luaK_exp2val(fs,e);
  switch(e->k) {
  case VNIL:
    local_18 = 0;
    local_30 = (Value)fs->ls->h;
    local_28 = 0x45;
    goto LAB_0011fadb;
  case VTRUE:
    local_30.b = 1;
    local_28 = 1;
    break;
  case VFALSE:
    local_30.i = (ulong)(uint)local_30.i._4_4_ << 0x20;
    local_28 = 1;
    break;
  case VK:
    goto switchD_0011fa50_caseD_4;
  case VKFLT:
    local_30 = *(Value *)&e->u;
    local_28 = 3;
    break;
  case VKINT:
    local_30 = *(Value *)&e->u;
    local_28 = 2;
    local_18 = 0x13;
    local_20 = local_30;
LAB_0011fadb:
    v = &local_20;
    goto LAB_0011fade;
  default:
    goto switchD_0011fa50_default;
  }
  v = &local_30;
LAB_0011fade:
  iVar1 = addk(fs,(TValue *)&local_30,(TValue *)v);
  (e->u).info = iVar1;
switchD_0011fa50_caseD_4:
  e->k = VK;
  if ((e->u).info < 0x100) {
    uVar2 = (e->u).info | 0x100;
  }
  else {
switchD_0011fa50_default:
    uVar2 = luaK_exp2anyreg(fs,e);
  }
  return uVar2;
}

Assistant:

int luaK_exp2RK(FuncState *fs, expdesc *e) {
    luaK_exp2val(fs, e);
    switch (e->k) {  /* move constants to 'k' */
        case VTRUE:
            e->u.info = boolK(fs, 1);
            goto vk;
        case VFALSE:
            e->u.info = boolK(fs, 0);
            goto vk;
        case VNIL:
            e->u.info = nilK(fs);
            goto vk;
        case VKINT:
            e->u.info = luaK_intK(fs, e->u.ival);
            goto vk;
        case VKFLT:
            e->u.info = luaK_numberK(fs, e->u.nval);
            goto vk;
        case VK:
        vk:
            e->k = VK;
            if (e->u.info <= MAXINDEXRK)  /* constant fits in 'argC'? */
                return RKASK(e->u.info);
            else break;
        default:
            break;
    }
    /* not a constant in the right range: put it in a register */
    return luaK_exp2anyreg(fs, e);
}